

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::FilterHelper<unsigned_int>
              (JavascriptArray *pArr,RecyclableObject *obj,uint length,Arguments *args,
              ScriptContext *scriptContext)

{
  bool bVar1;
  Var pvVar2;
  RecyclableObject *callBackFn;
  JavascriptArray *newObj;
  JavascriptArray *this;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  bool local_31 [8];
  bool isBuiltinArrayCtor;
  
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,pArr);
  if (((ulong)args->Info & 0xfffffe) != 0) {
    pvVar2 = Arguments::operator[](args,1);
    bVar1 = JavascriptConversion::IsCallable(pvVar2);
    if (bVar1) {
      pvVar2 = Arguments::operator[](args,1);
      callBackFn = VarTo<Js::RecyclableObject>(pvVar2);
      if ((*(uint *)&args->Info & 0xffffff) < 3) {
        jsReentLock._24_8_ =
             (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      else {
        jsReentLock._24_8_ = Arguments::operator[](args,2);
      }
      local_31[0] = true;
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      newObj = (JavascriptArray *)
               ArraySpeciesCreate<int>(obj,0,scriptContext,(bool *)0x0,(bool *)0x0,local_31);
      *(bool *)((long)local_60 + 0x108) = true;
      if (newObj == (JavascriptArray *)0x0) {
        this = JavascriptLibrary::CreateArray
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary,0);
        newObj = this;
        if ((this->head).ptr == EmptySegment) {
          AllocateHead<void*>(this);
        }
      }
      else {
        bVar1 = IsNonES5Array(newObj);
        if ((bVar1) &&
           (this = UnsafeVarTo<Js::JavascriptArray>(newObj), this != (JavascriptArray *)0x0)) {
          bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(this);
          if ((bVar1) &&
             (this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(this),
             this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
            JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
          }
          JsReentLock::setSecondObjectForMutation((JsReentLock *)local_60,this);
        }
        else {
          this = (JavascriptArray *)0x0;
        }
      }
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pvVar2 = FilterObjectHelper<unsigned_int>
                         (obj,length,0,this,(RecyclableObject *)newObj,0,callBackFn,
                          (Var)jsReentLock._24_8_,scriptContext);
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      return pvVar2;
    }
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,L"Array.prototype.filter");
}

Assistant:

Var JavascriptArray::FilterHelper(JavascriptArray* pArr, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.filter"));
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If the source object is an Array exotic object we should try to load the constructor property and use it to construct the return object.
        bool isBuiltinArrayCtor = true;
        JS_REENTRANT_NO_MUTATE(jsReentLock, RecyclableObject* newObj = ArraySpeciesCreate(obj, 0, scriptContext, nullptr, nullptr, &isBuiltinArrayCtor));
        JavascriptArray* newArr = nullptr;

        if (newObj == nullptr)
        {
            newArr = scriptContext->GetLibrary()->CreateArray(0);
            newArr->EnsureHead<Var>();
            newObj = newArr;
        }
        else
        {
            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
                SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, newArr);
            }
        }

        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FilterObjectHelper<T>(obj, length, 0u, newArr, newObj, 0u, callBackFn, thisArg, scriptContext));
    }